

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O1

void __thiscall
GslSpan_FixedSizeConversions_Test::~GslSpan_FixedSizeConversions_Test
          (GslSpan_FixedSizeConversions_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (GslSpan, FixedSizeConversions) {
    int arr[] = {1, 2, 3, 4};

    // converting to an span from an equal size array is ok
    span<int, 4> s4 = make_span (arr);
    EXPECT_EQ (s4.length (), 4);

    // converting to dynamic_range is always ok
    {
        span<int> s = s4;
        EXPECT_EQ (s.length (), s4.length ());
        static_cast<void> (s);
    }

// initialization or assignment to static span that REDUCES size is NOT ok
#ifdef CONFIRM_COMPILATION_ERRORS
    { span<int, 2> s = arr; }
    {
        span<int, 2> s2 = s4;
        static_cast<void> (s2);
    }
#endif

// even when done dynamically
#if 0
    {
        span<int> s = make_span (arr);
        auto f = [&]() {
            span<int, 2> s2 = s;
            static_cast<void>(s2);
        };
        CHECK_THROW(f(), fail_fast);
    }
#endif
    // but doing so explicitly is ok

    // you can convert statically
    {
        span<int, 2> s2 = {arr, 2};
        static_cast<void> (s2);
    }
    {
        span<int, 1> s1 = s4.first<1> ();
        static_cast<void> (s1);
    }

    // ...or dynamically
    {
        // NB: implicit conversion to span<int,1> from span<int>
        span<int, 1> s1 = s4.first (1);
        static_cast<void> (s1);
    }

// initialization or assignment to static span that requires size INCREASE is not ok.
#if 0
    int arr2[2] = {1, 2};
#endif
#ifdef CONFIRM_COMPILATION_ERRORS
    { span<int, 4> s3 = arr2; }
    {
        span<int, 2> s2 = arr2;
        span<int, 4> s4a = s2;
    }
#endif
#if 0
    {
        auto f = [&]() {
            span<int, 4> s4 = {arr2, 2};
            static_cast<void>(s4);
        };
        CHECK_THROW(f(), fail_fast);
    }
    // this should fail - we are trying to assign a small dynamic span to a fixed_size larger one
    span<int> av = arr2;
    auto f = [&]() {
        span<int, 4> s4 = av;
        static_cast<void>(s4);
    };
    CHECK_THROW(f(), fail_fast);
#endif
}